

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void CheckCaption(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  AttVal *av;
  AttVal *attval;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  prvTidyCheckAttributes(doc,node);
  av = prvTidyAttrGetById(node,TidyAttr_ALIGN);
  if ((av != (AttVal *)0x0) && (av->value != (tmbstr)0x0)) {
    if (((av == (AttVal *)0x0) ||
        ((av->value == (tmbstr)0x0 || (iVar1 = prvTidytmbstrcasecmp(av->value,"left"), iVar1 != 0)))
        ) && ((av == (AttVal *)0x0 ||
              ((av->value == (tmbstr)0x0 ||
               (iVar1 = prvTidytmbstrcasecmp(av->value,"right"), iVar1 != 0)))))) {
      if ((((av == (AttVal *)0x0) || (av->value == (tmbstr)0x0)) ||
          (iVar1 = prvTidytmbstrcasecmp(av->value,"top"), iVar1 != 0)) &&
         (((av == (AttVal *)0x0 || (av->value == (tmbstr)0x0)) ||
          (iVar1 = prvTidytmbstrcasecmp(av->value,"bottom"), iVar1 != 0)))) {
        prvTidyReportAttrError(doc,node,av,0x22b);
      }
      else {
        prvTidyConstrainVersion(doc,0xfffffffc);
      }
    }
    else {
      prvTidyConstrainVersion(doc,0x248);
    }
  }
  return;
}

Assistant:

void CheckCaption(TidyDocImpl* doc, Node *node)
{
    AttVal *attval;

    TY_(CheckAttributes)(doc, node);

    attval = TY_(AttrGetById)(node, TidyAttr_ALIGN);

    if (!AttrHasValue(attval))
        return;

    if (AttrValueIs(attval, "left") || AttrValueIs(attval, "right"))
        TY_(ConstrainVersion)(doc, VERS_HTML40_LOOSE);
    else if (AttrValueIs(attval, "top") || AttrValueIs(attval, "bottom"))
        TY_(ConstrainVersion)(doc, ~(VERS_HTML20|VERS_HTML32));
    else
        TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
}